

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O3

bool ConvertExpression(wstring *exp,int *Result)

{
  bool bVar1;
  CStringList List;
  CExpressionCommandList ExpList;
  CStringList local_68;
  CExpressionCommandList local_48;
  string local_30;
  
  local_68.data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.Entries = (tExpressionCommandEntry *)0x0;
  local_48.EntryCount = 0;
  local_48.initialized = false;
  convertWStringToUtf8(&local_30,exp);
  bVar1 = ConvertInfixToPostfix(local_30._M_dataplus._M_p,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (bVar1) {
    bVar1 = CheckPostfix(&local_68,false);
    if (bVar1) {
      bVar1 = CExpressionCommandList::Load(&local_48,&local_68);
      if (bVar1) {
        bVar1 = ParsePostfix(&local_48,(CStringList *)0x0,Result);
        goto LAB_0013b4b0;
      }
    }
  }
  bVar1 = false;
LAB_0013b4b0:
  CExpressionCommandList::~CExpressionCommandList(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.data);
  return bVar1;
}

Assistant:

bool ConvertExpression(const std::wstring& exp, int& Result)
{
	CStringList List;
	CExpressionCommandList ExpList;
	if (ConvertInfixToPostfix((char*)convertWStringToUtf8(exp).c_str(),List) == false) return false;
	if (CheckPostfix(List,false) == false) return false;
	if (ExpList.Load(List) == false) return false;
	if (ParsePostfix(ExpList,NULL,Result) == false) return false;
	return true;
}